

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

FuncVec * __thiscall
dg::llvmdg::LazyLLVMCallGraph::_getAddressTakenFuns
          (FuncVec *__return_storage_ptr__,LazyLLVMCallGraph *this,CallInst *C)

{
  pointer *pppFVar1;
  pointer ppFVar2;
  iterator __position;
  bool bVar3;
  CallInst *extraout_RDX;
  CallInst *extraout_RDX_00;
  CallInst *extraout_RDX_01;
  CallInst *pCVar4;
  pointer ppFVar5;
  Function *fun;
  Function *local_30;
  
  pCVar4 = C;
  if (this->_address_taken_initialized == false) {
    _initializeAddressTaken(this);
    pCVar4 = extraout_RDX;
  }
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppFVar5 = (this->_address_taken).
            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (this->_address_taken).
            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar5 != ppFVar2) {
    do {
      local_30 = *ppFVar5;
      bVar3 = anon_unknown_2::callIsCompatible(local_30,C,(CallCompatibility)pCVar4);
      pCVar4 = extraout_RDX_00;
      if (bVar3) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
          _M_realloc_insert<llvm::Function_const*const&>
                    ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                     __return_storage_ptr__,__position,&local_30);
          pCVar4 = extraout_RDX_01;
        }
        else {
          *__position._M_current = local_30;
          pppFVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
      }
      ppFVar5 = ppFVar5 + 1;
    } while (ppFVar5 != ppFVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec _getAddressTakenFuns(const llvm::CallInst *C) {
        // FIXME: check that C calls initialized values
        // (in many non-executable pieces of code, the call may call
        // an uninitialized function pointer. Return no function
        // in such cases instead of all address taken functions.
        if (!_address_taken_initialized)
            _initializeAddressTaken();
        assert(_address_taken_initialized);

        FuncVec ret;
        // filter out compatible functions
        for (auto *fun : _address_taken) {
            if (callIsCompatible(fun, C)) {
                ret.push_back(fun);
            }
        }
        return ret;
    }